

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall cxx::ModelGrammar::ModelGrammar(ModelGrammar *this)

{
  karma_rule<ast::Model_()> *pkVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  karma_rule<fidler::ast::TypeCollection_()> *pkVar4;
  karma_rule<fidler::ast::ConstantDef_()> *pkVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that;
  karma_rule<fidler::ast::Argument_()> *****local_140;
  karma_rule<fidler::ast::ConstantDef_()> **local_138;
  undefined1 local_130 [16];
  karma_rule<fidler::ast::Argument_()> *local_120;
  karma_rule<fidler::ast::Argument_()> *local_118;
  karma_rule<fidler::ast::TypeCollection_()> *local_110;
  code *local_108;
  karma_rule<fidler::ast::Argument_()> ***local_100;
  karma_rule<fidler::ast::Argument_()> *local_f8;
  karma_rule<fidler::ast::Argument_()> ****local_f0;
  InitializerGrammar *local_e8;
  karma_rule<fidler::ast::Argument_()> **local_e0;
  TypeGrammar *local_d8;
  undefined1 local_d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  karma_rule<fidler::ast::ConstantDef_()> *local_a8;
  karma_rule<fidler::ast::Interface_()> *local_a0;
  karma_rule<fidler::ast::Argument_()> local_98;
  karma_rule<ast::Model_()> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  karma_rule<fidler::ast::ConstantDef_()> *local_38;
  
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-grammar","");
  pkVar1 = &this->model_;
  (this->super_karma_grammar<ast::Model_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar1;
  psVar2 = &(this->super_karma_grammar<ast::Model_()>).name_;
  paVar3 = &(this->super_karma_grammar<ast::Model_()>).name_.field_2;
  (this->super_karma_grammar<ast::Model_()>).name_._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,local_140,(undefined1 *)((long)local_140 + (long)local_138));
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  local_48 = paVar3;
  local_40 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  (this->model_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar1;
  (this->model_).name_._M_dataplus._M_p = (pointer)&(this->model_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->model_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->model_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Model_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_98.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor.members.obj_ptr = &this->type_;
  local_50 = pkVar1;
  TypeGrammar::TypeGrammar
            ((TypeGrammar *)
             local_98.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.functor.members._0_8_);
  TypeDefinitionGrammar::TypeDefinitionGrammar(&this->type_definition_);
  local_98.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)&this->initializer_;
  local_98.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor._8_8_ = &this->type_definition_;
  InitializerGrammar::InitializerGrammar
            ((InitializerGrammar *)
             local_98.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.vtable);
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  pkVar4 = &this->type_collection_;
  (this->type_collection_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar4;
  (this->type_collection_).name_._M_dataplus._M_p = (pointer)&(this->type_collection_).name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->type_collection_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->type_collection_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::TypeCollection_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  local_98.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor._16_8_ = pkVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  local_a0 = &this->interface_;
  (this->interface_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_a0;
  (this->interface_).name_._M_dataplus._M_p = (pointer)&(this->interface_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->interface_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->interface_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Interface_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  local_98.name_.field_2._8_8_ = &this->method_;
  (this->method_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_98.name_.field_2._8_8_;
  (this->method_).name_._M_dataplus._M_p = (pointer)&(this->method_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->method_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->method_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  local_98.name_.field_2._M_allocated_capacity = (size_type)&this->broadcast_;
  (this->broadcast_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_98.name_.field_2._M_allocated_capacity;
  (this->broadcast_).name_._M_dataplus._M_p = (pointer)&(this->broadcast_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->broadcast_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->broadcast_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Broadcast_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  local_98.name_._M_string_length = (size_type)&this->argument_;
  (this->argument_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_98.name_._M_string_length;
  (this->argument_).name_._M_dataplus._M_p = (pointer)&(this->argument_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->argument_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->argument_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_140 = (karma_rule<fidler::ast::Argument_()> *****)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"unnamed-rule","");
  local_a8 = &this->constant_def_;
  (this->constant_def_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_a8;
  (this->constant_def_).name_._M_dataplus._M_p = (pointer)&(this->constant_def_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->constant_def_).name_,local_140,
             (undefined1 *)((long)local_140 + (long)local_138));
  (this->constant_def_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ConstantDef_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_140 != (karma_rule<fidler::ast::Argument_()> *****)local_130) {
    operator_delete(local_140);
  }
  local_100 = &local_e0;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)0x3f8260;
  local_d8 = (TypeGrammar *)&boost::spirit::standard::string;
  local_f0 = &local_100;
  local_f8 = (karma_rule<fidler::ast::Argument_()> *)0x3f826b;
  local_e8 = (InitializerGrammar *)&local_110;
  local_140 = &local_f0;
  local_138 = (karma_rule<fidler::ast::ConstantDef_()> **)&local_120;
  local_120 = (karma_rule<fidler::ast::Argument_()> *)local_a0;
  local_110 = pkVar4;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Model(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[11]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Interface(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>>
            (pkVar1);
  uVar9 = local_98.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor._8_8_;
  pkVar5 = local_a8;
  local_120 = (karma_rule<fidler::ast::Argument_()> *)&boost::spirit::standard::string;
  local_118 = (karma_rule<fidler::ast::Argument_()> *)fidler::snake_case;
  local_110 = (karma_rule<fidler::ast::TypeCollection_()> *)0x3f8273;
  local_108 = (code *)&local_120;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)&local_110;
  local_d8 = (TypeGrammar *)0x3eec87;
  local_100 = (karma_rule<fidler::ast::Argument_()> ***)(local_d0 + 0x18);
  local_b8._M_allocated_capacity = (size_type)&local_e0;
  local_f8 = (karma_rule<fidler::ast::Argument_()> *)(local_d0 + 0x10);
  local_d0._16_8_ =
       local_98.f.
       super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
       .super_function_base.functor._8_8_;
  local_b8._8_8_ = local_a8;
  local_f0 = &local_100;
  local_98.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3f826e;
  local_98.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_38 = (karma_rule<fidler::ast::ConstantDef_()> *)local_d0;
  local_d0._8_8_ = "\n\n";
  local_140 = &local_f0;
  local_138 = &local_38;
  local_e8 = (InitializerGrammar *)(local_b8._M_local_buf + 8);
  local_d0._0_8_ = &local_98;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[11]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::p___:tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,1l>const&>,2l>>
            (pkVar4);
  uVar8 = local_98.name_.field_2._8_8_;
  uVar7 = local_98.name_.field_2._M_allocated_capacity;
  local_98.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&boost::spirit::standard::string;
  local_98.name_._M_dataplus._M_p = (pointer)fidler::pascal_case;
  local_d0._0_8_ = "class ";
  local_120 = (karma_rule<fidler::ast::Argument_()> *)local_d0;
  local_118 = (karma_rule<fidler::ast::Argument_()> *)0x3eec87;
  local_f0 = &local_100;
  local_140 = &local_f0;
  local_138 = (karma_rule<fidler::ast::ConstantDef_()> **)0x3f827e;
  local_b8._M_allocated_capacity = uVar9;
  local_110 = (karma_rule<fidler::ast::TypeCollection_()> *)&local_120;
  local_108 = (code *)(local_d0 + 0x18);
  local_d0._16_8_ = local_98.name_.field_2._8_8_;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)&local_110;
  local_d8 = (TypeGrammar *)(local_d0 + 0x10);
  local_b8._8_8_ = local_98.name_.field_2._M_allocated_capacity;
  local_100 = &local_e0;
  local_38 = pkVar5;
  local_f8 = (karma_rule<fidler::ast::Argument_()> *)(local_b8._M_local_buf + 8);
  local_e8 = (InitializerGrammar *)&local_38;
  local_d0._8_8_ = &local_98;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Interface(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_e___s_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>>
            (local_a0);
  sVar6 = local_98.name_._M_string_length;
  local_110 = (karma_rule<fidler::ast::TypeCollection_()> *)&boost::spirit::standard::string;
  local_108 = fidler::snake_case;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)0x3f8282;
  local_d8 = (TypeGrammar *)&local_110;
  local_98.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_._0_1_ = 0x28;
  local_120 = (karma_rule<fidler::ast::Argument_()> *)local_98.name_._M_string_length;
  local_118 = (karma_rule<fidler::ast::Argument_()> *)0x3eecaa;
  local_d0._0_8_ = &local_120;
  local_f0 = &local_100;
  local_e8 = (InitializerGrammar *)local_d0;
  local_140 = &local_f0;
  local_138 = (karma_rule<fidler::ast::ConstantDef_()> **)0x3f82ba;
  local_100 = &local_e0;
  local_f8 = &local_98;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Method(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<void(&)(std::__cxx11::string&)>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (uVar8);
  local_110 = (karma_rule<fidler::ast::TypeCollection_()> *)&boost::spirit::standard::string;
  local_108 = fidler::snake_case;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)0x3f828a;
  local_d8 = (TypeGrammar *)&local_110;
  local_f8 = (karma_rule<fidler::ast::Argument_()> *)0x3f829b;
  local_120 = (karma_rule<fidler::ast::Argument_()> *)sVar6;
  local_118 = (karma_rule<fidler::ast::Argument_()> *)0x3eecaa;
  local_d0._0_8_ = &local_120;
  local_f0 = &local_100;
  local_e8 = (InitializerGrammar *)local_d0;
  local_140 = &local_f0;
  local_138 = (karma_rule<fidler::ast::ConstantDef_()> **)0x3f82b0;
  local_100 = &local_e0;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Broadcast(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[17]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<void(&)(std::__cxx11::string&)>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[21]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>>,2l>>
            (uVar7);
  uVar7 = local_98.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor.members._0_8_;
  local_b8._M_local_buf[0] = 1;
  local_110 = (karma_rule<fidler::ast::TypeCollection_()> *)local_d0;
  local_108 = (code *)0x3f951a;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)&local_110;
  local_d8 = (TypeGrammar *)
             local_98.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.functor.members._0_8_;
  local_d0[0x10] = 1;
  local_b8._M_local_buf[8] = '>';
  local_100 = &local_e0;
  local_f8 = (karma_rule<fidler::ast::Argument_()> *)&local_120;
  local_f0 = &local_100;
  local_e8 = (InitializerGrammar *)0x3f82bf;
  local_140 = &local_f0;
  local_138 = (karma_rule<fidler::ast::ConstantDef_()> **)&boost::spirit::standard::string;
  local_120 = &local_98;
  local_118 = (karma_rule<fidler::ast::Argument_()> *)(local_b8._M_local_buf + 8);
  local_d0._0_8_ = (long)local_d0 + 0x18;
  local_98.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )(local_d0 + 0x10);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[13]>,0l>>,2l>const&,cxx::TypeGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>>
            (sVar6);
  local_d0._0_8_ = "const ";
  local_d0._8_8_ = uVar7;
  local_d0[0x10] = 1;
  local_98.name_._M_dataplus._M_p = "[]";
  local_120 = (karma_rule<fidler::ast::Argument_()> *)local_d0;
  local_b8._M_local_buf[8] = 0x20;
  local_110 = (karma_rule<fidler::ast::TypeCollection_()> *)&local_120;
  local_e0 = (karma_rule<fidler::ast::Argument_()> **)&local_110;
  local_d8 = (TypeGrammar *)&boost::spirit::standard::string;
  local_100 = &local_e0;
  local_f8 = (karma_rule<fidler::ast::Argument_()> *)0x3eed25;
  local_f0 = &local_100;
  local_e8 = (InitializerGrammar *)
             local_98.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.vtable;
  local_140 = &local_f0;
  local_138 = (karma_rule<fidler::ast::ConstantDef_()> **)0x3f827f;
  local_118 = &local_98;
  local_108 = (code *)(local_b8._M_local_buf + 8);
  local_b8._M_allocated_capacity = (size_type)(local_d0 + 0x10);
  local_98.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )((long)local_d0 + 0x18);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,cxx::TypeGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>const&,cxx::InitializerGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>>
            (local_a8);
  return;
}

Assistant:

ModelGrammar::ModelGrammar() :
		ModelGrammar::base_type(model_)
{
	namespace karma = boost::spirit::karma;

	model_
		%= "package: '"
		<< karma::string
		<< "'\n"
		<< *type_collection_
		<< *interface_
		;

	type_collection_
		%= -("namespace " << karma::string[fidler::snake_case] << "\n{\n")
		<< *type_definition_
		<< *constant_def_
		<< -("} // namespace " << karma::string << "\n\n")
		;

	interface_
		%= "class "
		<< karma::string[fidler::pascal_case]
		<< "\n{\n"
		<< *type_definition_
		<< *method_
		<< *broadcast_
		<< *constant_def_
		<< "};\n"
		;

	method_
		%= "  void "
		<< karma::string[fidler::snake_case]
		<< '('
		<< -(argument_ % ", ")
		<< ");\n\n"
		;

	broadcast_
		%= "  connection on_"
		<< karma::string[fidler::snake_case]
		<< "(std::function<void("
		<< -(argument_ % ", ")
		<< ")> handler);\n\n"
		;

	argument_
		%= (!karma::bool_(true) | "std::vector<")
		<< type_
		<< (!karma::bool_(true) | '>')
		<< " const& "
		<< karma::string
		;

	constant_def_
		%= "const "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< " = "
		<< initializer_
		<< ";\n"
		;
}